

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::GenerateSource
          (FileGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FileDescriptor FVar2;
  pointer puVar3;
  pointer puVar4;
  size_type sVar5;
  pointer puVar6;
  bool bVar7;
  FileDescriptor *pFVar8;
  FileDescriptor *pFVar9;
  const_iterator cVar10;
  FileDescriptor *pFVar11;
  undefined8 uVar12;
  mapped_type *pmVar13;
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *extraout_RDX_03;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator;
  long lVar14;
  pointer puVar15;
  pointer puVar16;
  pointer ppFVar17;
  pointer puVar18;
  pointer puVar19;
  char *pcVar20;
  int iVar21;
  Descriptor *message;
  string header_extension;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  deps_with_extensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  public_import_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fwd_decls;
  string local_1c8;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_1a8;
  undefined1 local_190 [32];
  _Base_ptr local_170;
  size_t local_168;
  _Rb_tree_node_base *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  key_type local_138;
  ImportWriter local_118;
  
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_118.generate_for_named_framework_.field_2;
  local_118.generate_for_named_framework_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"GPBProtocolBuffers_RuntimeSupport.h","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
             &local_118.generate_for_named_framework_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.generate_for_named_framework_._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.generate_for_named_framework_._M_dataplus._M_p);
  }
  PrintFileRuntimePreamble(this,printer,&local_158);
  pFVar9 = this->file_;
  if (*(int *)(pFVar9 + 0x30) < 1) {
    lVar14 = (long)*(int *)(pFVar9 + 0x2c);
    if (0 < lVar14) {
      message = *(Descriptor **)(pFVar9 + 0x58);
      do {
        bVar7 = anon_unknown_0::MessageContainsEnums(message);
        if (bVar7) goto LAB_002d542a;
        message = message + 0x88;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
  }
  else {
LAB_002d542a:
    io::Printer::Print<>(printer,"#import <stdatomic.h>\n\n");
    pFVar9 = this->file_;
  }
  local_1a8.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar21 = 0;
  local_1a8.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160 = (_Rb_tree_node_base *)&local_118.generate_for_named_framework_._M_string_length;
  local_118.generate_for_named_framework_._M_string_length._0_4_ = 0;
  local_118.generate_for_named_framework_.field_2._M_allocated_capacity = 0;
  local_118.named_framework_to_proto_path_mappings_path_._M_string_length = 0;
  local_118.generate_for_named_framework_.field_2._8_8_ = local_160;
  local_118.named_framework_to_proto_path_mappings_path_._M_dataplus._M_p = (pointer)local_160;
  if (0 < *(int *)(pFVar9 + 0x20)) {
    do {
      pFVar8 = FileDescriptor::dependency(pFVar9,iVar21);
      anon_unknown_0::CollectMinimalFileDepsContainingExtensionsWorker
                (pFVar8,&local_1a8,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_118);
      iVar21 = iVar21 + 1;
    } while (iVar21 < *(int *)(pFVar9 + 0x20));
  }
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)&local_118);
  ImportWriter::ImportWriter
            (&local_118,&(this->options_).generate_for_named_framework,
             &(this->options_).named_framework_to_proto_path_mappings_path,
             &(this->options_).runtime_import_prefix,this->is_bundled_proto_);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,".pbobjc.h","");
  ImportWriter::AddFile(&local_118,this->file_,&local_1c8);
  local_190._24_8_ = local_190 + 8;
  local_190._8_4_ = _S_red;
  local_190._16_8_ = (_Base_ptr)0x0;
  local_168 = 0;
  pFVar9 = this->file_;
  local_170 = (_Base_ptr)local_190._24_8_;
  if (0 < *(int *)(pFVar9 + 0x24)) {
    lVar14 = 0;
    do {
      pFVar9 = FileDescriptor::dependency(pFVar9,*(int *)(*(long *)(pFVar9 + 0x48) + lVar14 * 4));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_190,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar9);
      lVar14 = lVar14 + 1;
      pFVar9 = this->file_;
    } while (lVar14 < *(int *)(pFVar9 + 0x24));
  }
  if (0 < *(int *)(pFVar9 + 0x20)) {
    iVar21 = 0;
    do {
      pFVar9 = FileDescriptor::dependency(pFVar9,iVar21);
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_190,*(key_type **)pFVar9);
      if (cVar10._M_node == (_Base_ptr)(local_190 + 8)) {
        ImportWriter::AddFile(&local_118,pFVar9,&local_1c8);
      }
      iVar21 = iVar21 + 1;
      pFVar9 = this->file_;
    } while (iVar21 < *(int *)(pFVar9 + 0x20));
  }
  if (local_1a8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppFVar17 = local_1a8.
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pFVar9 = *ppFVar17;
      pFVar8 = this->file_;
      if (0 < *(int *)(pFVar8 + 0x20)) {
        iVar21 = 0;
        do {
          pFVar11 = FileDescriptor::dependency(pFVar8,iVar21);
          if (pFVar11 == pFVar9) goto LAB_002d5646;
          iVar21 = iVar21 + 1;
        } while (iVar21 < *(int *)(pFVar8 + 0x20));
        pFVar9 = *ppFVar17;
      }
      ImportWriter::AddFile(&local_118,pFVar9,&local_1c8);
LAB_002d5646:
      ppFVar17 = ppFVar17 + 1;
    } while (ppFVar17 !=
             local_1a8.
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ImportWriter::Print(&local_118,printer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  ImportWriter::~ImportWriter(&local_118);
  puVar19 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 == puVar3) {
    local_160 = (_Rb_tree_node_base *)&local_118.generate_for_named_framework_._M_string_length;
    local_118.generate_for_named_framework_._M_string_length._0_4_ = 0;
    local_118.generate_for_named_framework_.field_2._M_allocated_capacity = 0;
    local_118.named_framework_to_proto_path_mappings_path_._M_string_length = 0;
    bVar7 = true;
    local_118.generate_for_named_framework_.field_2._8_8_ = local_160;
    local_118.named_framework_to_proto_path_mappings_path_._M_dataplus._M_p = (pointer)local_160;
  }
  else {
    do {
      puVar15 = puVar19 + 1;
      bVar7 = MessageGenerator::IncludesOneOfDefinition
                        ((puVar19->_M_t).
                         super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                         ._M_head_impl);
      puVar19 = puVar15;
    } while (puVar15 != puVar3 && !bVar7);
    bVar7 = !bVar7;
    puVar19 = (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_118.generate_for_named_framework_._M_string_length._0_4_ = 0;
    local_118.generate_for_named_framework_.field_2._M_allocated_capacity = 0;
    local_118.generate_for_named_framework_.field_2._8_8_ =
         &local_118.generate_for_named_framework_._M_string_length;
    local_118.named_framework_to_proto_path_mappings_path_._M_string_length = 0;
    local_118.named_framework_to_proto_path_mappings_path_._M_dataplus._M_p =
         (pointer)local_118.generate_for_named_framework_.field_2._8_8_;
    if (puVar19 != puVar3) {
      do {
        MessageGenerator::DetermineObjectiveCClassDefinitions
                  ((puVar19->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                   ._M_head_impl,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_118);
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar3);
    }
  }
  puVar16 = (this->extension_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->extension_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != puVar4) {
    do {
      ExtensionGenerator::DetermineObjectiveCClassDefinitions
                ((puVar16->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
                 ._M_head_impl,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_118);
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar4);
  }
  io::Printer::Print<>
            (printer,
             "// @@protoc_insertion_point(imports)\n\n#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n"
            );
  if (!bVar7) {
    io::Printer::Print<>(printer,"#pragma clang diagnostic ignored \"-Wdirect-ivar-access\"\n");
  }
  if (local_118.named_framework_to_proto_path_mappings_path_._M_string_length != 0) {
    io::Printer::Print<>
              (printer,"#pragma clang diagnostic ignored \"-Wdollar-in-identifier-extension\"\n");
  }
  io::Printer::Print<>(printer,"\n");
  if (local_118.named_framework_to_proto_path_mappings_path_._M_string_length != 0) {
    io::Printer::Print<>
              (printer,
               "#pragma mark - Objective C Class declarations\n// Forward declarations of Objective C classes that we can use as\n// static values in struct initializers.\n// We don\'t use [Foo class] because it is not a static value.\n"
              );
  }
  uVar12 = local_118.generate_for_named_framework_.field_2._8_8_;
  if ((_Rb_tree_node_base *)local_118.generate_for_named_framework_.field_2._8_8_ != local_160) {
    do {
      io::Printer::Print<char[6],std::__cxx11::string>
                (printer,"$value$\n",(char (*) [6])0x43496c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (uVar12 + 0x20));
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
    } while ((_Rb_tree_node_base *)uVar12 != local_160);
  }
  if (local_118.named_framework_to_proto_path_mappings_path_._M_string_length != 0) {
    io::Printer::Print<>(printer,"\n");
  }
  io::Printer::Print<char[16],std::__cxx11::string>
            (printer,"#pragma mark - $root_class_name$\n\n@implementation $root_class_name$\n\n",
             (char (*) [16])"root_class_name",&this->root_class_name_);
  pFVar9 = this->file_;
  bVar7 = anon_unknown_0::FileContainsExtensions(pFVar9);
  if ((bVar7) ||
     (local_1a8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    io::Printer::Print<>
              (printer,
               "+ (GPBExtensionRegistry*)extensionRegistry {\n  // This is called by +initialize so there is no need to worry\n  // about thread safety and initialization of registry.\n  static GPBExtensionRegistry* registry = nil;\n  if (!registry) {\n    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n    registry = [[GPBExtensionRegistry alloc] init];\n"
              );
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (bVar7) {
      io::Printer::Print<>(printer,"static GPBExtensionDescription descriptions[] = {\n");
      io::Printer::Indent(printer);
      puVar4 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar16 = (this->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
          puVar16 = puVar16 + 1) {
        ExtensionGenerator::GenerateStaticVariablesInitialization
                  ((puVar16->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
                   ._M_head_impl,printer);
      }
      puVar3 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar19 = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar3;
          puVar19 = puVar19 + 1) {
        MessageGenerator::GenerateStaticVariablesInitialization
                  ((puVar19->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                   ._M_head_impl,printer);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>
                (printer,
                 "};\nfor (size_t i = 0; i < sizeof(descriptions) / sizeof(descriptions[0]); ++i) {\n  GPBExtensionDescriptor *extension =\n      [[GPBExtensionDescriptor alloc] initWithExtensionDescription:&descriptions[i]\n                                                     usesClassRefs:YES];\n  [registry addExtension:extension];\n  [self globallyRegisterExtension:extension];\n  [extension release];\n}\n"
                );
    }
    if (local_1a8.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1a8.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print<>
                (printer,
                 "// None of the imports (direct or indirect) defined extensions, so no need to add\n// them to this registry.\n"
                );
    }
    else {
      io::Printer::Print<>
                (printer,"// Merge in the imports (direct or indirect) that defined extensions.\n");
      if (local_1a8.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1a8.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pFVar9 = extraout_RDX;
        ppFVar17 = local_1a8.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          FileClassName_abi_cxx11_((string *)local_190,(objectivec *)*ppFVar17,pFVar9);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,"[registry addExtensions:[$dependency$ extensionRegistry]];\n",
                     (char (*) [11])0x437a9a,(string *)local_190);
          pFVar9 = extraout_RDX_00;
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_);
            pFVar9 = extraout_RDX_01;
          }
          ppFVar17 = ppFVar17 + 1;
        } while (ppFVar17 !=
                 local_1a8.
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    pcVar20 = "  }\n  return registry;\n}\n";
  }
  else {
    pcVar20 = 
    "// No extensions in the file and no imports, so no need to generate\n// +extensionRegistry.\n";
    if (0 < *(int *)(pFVar9 + 0x20)) {
      pcVar20 = 
      "// No extensions in the file and none of the imports (direct or indirect)\n// defined extensions, so no need to generate +extensionRegistry.\n"
      ;
    }
  }
  io::Printer::Print<>(printer,pcVar20);
  io::Printer::Print<>(printer,"\n@end\n\n");
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002d5d0f;
  local_190._8_4_ = _S_red;
  local_190._16_8_ = (_Base_ptr)0x0;
  local_190._24_8_ = local_190 + 8;
  local_168 = 0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_170 = (_Base_ptr)local_190._24_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"root_class_name","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_190,&local_1c8);
  std::__cxx11::string::_M_assign((string *)pmVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"package","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_190,&local_1c8);
  std::__cxx11::string::_M_assign((string *)pmVar13);
  pFVar9 = extraout_RDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
    pFVar9 = extraout_RDX_03;
  }
  FileClassPrefix_abi_cxx11_(&local_1c8,(objectivec *)this->file_,pFVar9);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"objc_prefix","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_190,&local_138);
  std::__cxx11::string::operator=((string *)pmVar13,(string *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  FVar2 = this->file_[0x3a];
  if (FVar2 == (FileDescriptor)0x0) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"syntax","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_190,&local_1c8);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x408bf7);
LAB_002d5c5d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
  }
  else {
    if (FVar2 == (FileDescriptor)0x2) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"syntax","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_190,&local_1c8);
      std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x408c0c);
      goto LAB_002d5c5d;
    }
    if (FVar2 == (FileDescriptor)0x3) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"syntax","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_190,&local_1c8);
      std::__cxx11::string::_M_replace((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x408c20);
      goto LAB_002d5c5d;
    }
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_190,
                     "#pragma mark - $root_class_name$_FileDescriptor\n\nstatic GPBFileDescriptor *$root_class_name$_FileDescriptor(void) {\n  // This is called by +initialize so there is no need to worry\n  // about thread safety of the singleton.\n  static GPBFileDescriptor *descriptor = NULL;\n  if (!descriptor) {\n    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n"
                    );
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"objc_prefix","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_190,&local_1c8);
  sVar5 = pmVar13->_M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  pcVar20 = 
  "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n                                                 objcPrefix:@\"$objc_prefix$\"\n                                                     syntax:$syntax$];\n"
  ;
  if (sVar5 == 0) {
    pcVar20 = 
    "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n                                                     syntax:$syntax$];\n"
    ;
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_190,pcVar20);
  io::Printer::Print<>(printer,"  }\n  return descriptor;\n}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_190);
LAB_002d5d0f:
  puVar6 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (this->enum_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar6; puVar18 = puVar18 + 1
      ) {
    EnumGenerator::GenerateSource
              ((puVar18->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_false>
               ._M_head_impl,printer);
  }
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar3; puVar19 = puVar19 + 1
      ) {
    MessageGenerator::GenerateSource
              ((puVar19->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
               ._M_head_impl,printer);
  }
  io::Printer::Print<>
            (printer,"\n#pragma clang diagnostic pop\n\n// @@protoc_insertion_point(global_scope)\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
  if (local_1a8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  // #import the runtime support.
  std::vector<std::string> headers;
  headers.push_back("GPBProtocolBuffers_RuntimeSupport.h");
  PrintFileRuntimePreamble(printer, headers);

  // Enums use atomic in the generated code, so add the system import as needed.
  if (FileContainsEnums(file_)) {
    printer->Print(
        "#import <stdatomic.h>\n"
        "\n");
  }

  std::vector<const FileDescriptor*> deps_with_extensions;
  CollectMinimalFileDepsContainingExtensions(file_, &deps_with_extensions);

  {
    ImportWriter import_writer(
        options_.generate_for_named_framework,
        options_.named_framework_to_proto_path_mappings_path,
        options_.runtime_import_prefix,
        is_bundled_proto_);
    const std::string header_extension(kHeaderExtension);

    // #import the header for this proto file.
    import_writer.AddFile(file_, header_extension);

    // #import the headers for anything that a plain dependency of this proto
    // file (that means they were just an include, not a "public" include).
    std::set<std::string> public_import_names;
    for (int i = 0; i < file_->public_dependency_count(); i++) {
      public_import_names.insert(file_->public_dependency(i)->name());
    }
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor *dep = file_->dependency(i);
      bool public_import = (public_import_names.count(dep->name()) != 0);
      if (!public_import) {
        import_writer.AddFile(dep, header_extension);
      }
    }

    // If any indirect dependency provided extensions, it needs to be directly
    // imported so it can get merged into the root's extensions registry.
    // See the Note by CollectMinimalFileDepsContainingExtensions before
    // changing this.
    for (std::vector<const FileDescriptor*>::iterator iter =
             deps_with_extensions.begin();
         iter != deps_with_extensions.end(); ++iter) {
      if (!IsDirectDependency(*iter, file_)) {
        import_writer.AddFile(*iter, header_extension);
      }
    }

    import_writer.Print(printer);
  }

  bool includes_oneof = false;
  for (const auto& generator : message_generators_) {
    if (generator->IncludesOneOfDefinition()) {
      includes_oneof = true;
      break;
    }
  }

  std::set<std::string> fwd_decls;
  for (const auto& generator : message_generators_) {
    generator->DetermineObjectiveCClassDefinitions(&fwd_decls);
  }
  for (const auto& generator : extension_generators_) {
    generator->DetermineObjectiveCClassDefinitions(&fwd_decls);
  }

  // Note:
  //  deprecated-declarations suppression is only needed if some place in this
  //    proto file is something deprecated or if it references something from
  //    another file that is deprecated.
  //  dollar-in-identifier-extension is needed because we use references to
  //    objc class names that have $ in identifiers.
  printer->Print(
      "// @@protoc_insertion_point(imports)\n"
      "\n"
      "#pragma clang diagnostic push\n"
      "#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n");
  if (includes_oneof) {
    // The generated code for oneof's uses direct ivar access, suppress the
    // warning in case developer turn that on in the context they compile the
    // generated code.
    printer->Print(
        "#pragma clang diagnostic ignored \"-Wdirect-ivar-access\"\n");
  }
  if (!fwd_decls.empty()) {
    printer->Print(
      "#pragma clang diagnostic ignored \"-Wdollar-in-identifier-extension\"\n");
  }
  printer->Print(
      "\n");
  if (!fwd_decls.empty()) {
    printer->Print(
        "#pragma mark - Objective C Class declarations\n"
        "// Forward declarations of Objective C classes that we can use as\n"
        "// static values in struct initializers.\n"
        "// We don't use [Foo class] because it is not a static value.\n");
  }
  for (const auto& i : fwd_decls) {
    printer->Print("$value$\n", "value", i);
  }
  if (!fwd_decls.empty()) {
    printer->Print("\n");
  }
  printer->Print(
      "#pragma mark - $root_class_name$\n"
      "\n"
      "@implementation $root_class_name$\n\n",
      "root_class_name", root_class_name_);

  const bool file_contains_extensions = FileContainsExtensions(file_);

  // If there were any extensions or this file has any dependencies, output
  // a registry to override to create the file specific registry.
  if (file_contains_extensions || !deps_with_extensions.empty()) {
    printer->Print(
        "+ (GPBExtensionRegistry*)extensionRegistry {\n"
        "  // This is called by +initialize so there is no need to worry\n"
        "  // about thread safety and initialization of registry.\n"
        "  static GPBExtensionRegistry* registry = nil;\n"
        "  if (!registry) {\n"
        "    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n"
        "    registry = [[GPBExtensionRegistry alloc] init];\n");

    printer->Indent();
    printer->Indent();

    if (file_contains_extensions) {
      printer->Print(
          "static GPBExtensionDescription descriptions[] = {\n");
      printer->Indent();
      for (const auto& generator : extension_generators_) {
        generator->GenerateStaticVariablesInitialization(printer);
      }
      for (const auto& generator : message_generators_) {
        generator->GenerateStaticVariablesInitialization(printer);
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "for (size_t i = 0; i < sizeof(descriptions) / sizeof(descriptions[0]); ++i) {\n"
          "  GPBExtensionDescriptor *extension =\n"
          "      [[GPBExtensionDescriptor alloc] initWithExtensionDescription:&descriptions[i]\n"
          "                                                     usesClassRefs:YES];\n"
          "  [registry addExtension:extension];\n"
          "  [self globallyRegisterExtension:extension];\n"
          "  [extension release];\n"
          "}\n");
    }

    if (deps_with_extensions.empty()) {
      printer->Print(
          "// None of the imports (direct or indirect) defined extensions, so no need to add\n"
          "// them to this registry.\n");
    } else {
      printer->Print(
          "// Merge in the imports (direct or indirect) that defined extensions.\n");
      for (std::vector<const FileDescriptor*>::iterator iter =
               deps_with_extensions.begin();
           iter != deps_with_extensions.end(); ++iter) {
        const std::string root_class_name(FileClassName((*iter)));
        printer->Print(
            "[registry addExtensions:[$dependency$ extensionRegistry]];\n",
            "dependency", root_class_name);
      }
    }

    printer->Outdent();
    printer->Outdent();

    printer->Print(
        "  }\n"
        "  return registry;\n"
        "}\n");
  } else {
    if (file_->dependency_count() > 0) {
      printer->Print(
          "// No extensions in the file and none of the imports (direct or indirect)\n"
          "// defined extensions, so no need to generate +extensionRegistry.\n");
    } else {
      printer->Print(
          "// No extensions in the file and no imports, so no need to generate\n"
          "// +extensionRegistry.\n");
    }
  }

  printer->Print("\n@end\n\n");

  // File descriptor only needed if there are messages to use it.
  if (!message_generators_.empty()) {
    std::map<std::string, std::string> vars;
    vars["root_class_name"] = root_class_name_;
    vars["package"] = file_->package();
    vars["objc_prefix"] = FileClassPrefix(file_);
    switch (file_->syntax()) {
      case FileDescriptor::SYNTAX_UNKNOWN:
        vars["syntax"] = "GPBFileSyntaxUnknown";
        break;
      case FileDescriptor::SYNTAX_PROTO2:
        vars["syntax"] = "GPBFileSyntaxProto2";
        break;
      case FileDescriptor::SYNTAX_PROTO3:
        vars["syntax"] = "GPBFileSyntaxProto3";
        break;
    }
    printer->Print(vars,
        "#pragma mark - $root_class_name$_FileDescriptor\n"
        "\n"
        "static GPBFileDescriptor *$root_class_name$_FileDescriptor(void) {\n"
        "  // This is called by +initialize so there is no need to worry\n"
        "  // about thread safety of the singleton.\n"
        "  static GPBFileDescriptor *descriptor = NULL;\n"
        "  if (!descriptor) {\n"
        "    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n");
    if (!vars["objc_prefix"].empty()) {
      printer->Print(
          vars,
          "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n"
          "                                                 objcPrefix:@\"$objc_prefix$\"\n"
          "                                                     syntax:$syntax$];\n");
    } else {
      printer->Print(
          vars,
          "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n"
          "                                                     syntax:$syntax$];\n");
    }
    printer->Print(
        "  }\n"
        "  return descriptor;\n"
        "}\n"
        "\n");
  }

  for (const auto& generator : enum_generators_) {
    generator->GenerateSource(printer);
  }
  for (const auto& generator : message_generators_) {
    generator->GenerateSource(printer);
  }

  printer->Print(
    "\n"
    "#pragma clang diagnostic pop\n"
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}